

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O3

void __thiscall
OptionParser::setOption(OptionParser *this,string *keyword,string *value,Network *network)

{
  pointer pcVar1;
  InputError *pIVar2;
  bool bVar3;
  StringOption option;
  int iVar4;
  IndexOption option_00;
  ValueOption option_01;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  double local_38;
  double x;
  
  option = Utilities::findFullMatch(keyword,stringOptionKeywords);
  if ((int)option < 0) {
    option_00 = Utilities::findFullMatch(keyword,indexOptionKeywords);
    if ((int)option_00 < 0) {
      option_01 = Utilities::findFullMatch(keyword,valueOptionKeywords);
      if ((int)option_01 < 0) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar1 = (keyword->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar1,pcVar1 + keyword->_M_string_length);
        InputError::InputError(pIVar2,3,&local_78);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      bVar3 = Utilities::parseNumber<double>(value,&local_38);
      if (!bVar3) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        pcVar1 = (value->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar1,pcVar1 + value->_M_string_length);
        InputError::InputError(pIVar2,6,&local_58);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      Options::setOption(&network->options,option_01,local_38);
    }
    else {
      iVar4 = Options::setOption(&network->options,option_00,value,network);
      if (iVar4 != 0) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar1 = (value->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar1,pcVar1 + value->_M_string_length);
        InputError::InputError(pIVar2,iVar4,&local_98);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
  }
  else {
    iVar4 = Options::setOption(&network->options,option,value);
    if (iVar4 != 0) {
      pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      pcVar1 = (value->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + value->_M_string_length);
      InputError::InputError(pIVar2,iVar4,&local_b8);
      __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
    }
  }
  return;
}

Assistant:

void OptionParser::setOption(const string& keyword, const string& value,
                             Network* network)
{
    // ... try to assign value to a string option

    int option = Utilities::findFullMatch(keyword, stringOptionKeywords);
    if ( option >=  0 )
    {
        int err = network->options.setOption(
                      (Options::StringOption)option, value);
        if ( err ) throw InputError(err, value);
        return;
    }

    // ... try to assign value to a category option

    option = Utilities::findFullMatch(keyword, indexOptionKeywords);
    if ( option >= 0 )
    {
        int err = network->options.setOption(
                      (Options::IndexOption)option, value, network);
        if ( err ) throw InputError(err, value);
        return;
    }

    // ... try to assign value to a value option

    option = Utilities::findFullMatch(keyword, valueOptionKeywords);
    if ( option < 0 ) throw InputError(InputError::INVALID_KEYWORD, keyword);
    double x;
    if (!Utilities::parseNumber(value, x))
    {
        throw InputError(InputError::INVALID_NUMBER, value);
    }
    network->options.setOption((Options::ValueOption)option, x);
}